

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.h
# Opt level: O2

bool Memory::HeapBlockList::
     Contains<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>>
               (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *block,
               SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *list,
               SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *tail)

{
  for (; (list != block && (list != tail));
      list = SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>::GetNextBlock(list)) {
  }
  return list != tail;
}

Assistant:

static bool Contains(TBlockType * block, TBlockType * list, TBlockType * tail = nullptr)
    {
        TBlockType * heapBlock = list;
        while (heapBlock != tail)
        {
            if (heapBlock == block)
            {
                return true;
            }
            heapBlock = heapBlock->GetNextBlock();
        }
        return false;
    }